

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

art_node_t * art_node_erase(art_inner_node_t *node,art_key_chunk_t key_chunk)

{
  uint8_t *__src;
  uint8_t uVar1;
  undefined4 uVar2;
  art_node_t *child;
  byte bVar3;
  ushort uVar4;
  art_node48_t *node_00;
  uint uVar5;
  ulong uVar7;
  art_inner_node_t *inner_node;
  size_t sVar8;
  size_t i;
  long lVar9;
  long lVar10;
  ulong uVar6;
  
  switch(node->typecode) {
  case '\0':
    bVar3 = node[1].typecode;
    uVar6 = 0xffffffff;
    uVar5 = 0xffffffff;
    if ((ulong)bVar3 != 0) {
      uVar7 = 0;
      do {
        if (node[1].prefix[uVar7 - 1] == key_chunk) {
          uVar6 = uVar7 & 0xffffffff;
        }
        uVar5 = (uint)uVar6;
        uVar7 = uVar7 + 1;
      } while (bVar3 != uVar7);
    }
    if (uVar5 == 0xffffffff) {
      return (art_node_t *)node;
    }
    if (bVar3 != 2) {
      lVar9 = (long)(int)uVar5;
      sVar8 = (size_t)(int)(~uVar5 + (uint)bVar3);
      memmove(node[1].prefix + lVar9 + -1,node[1].prefix + lVar9,sVar8);
      memmove((void *)((long)node + lVar9 * 8 + 0x10),(void *)((long)node + lVar9 * 8 + 0x18),
              sVar8 << 3);
      node[1].typecode = node[1].typecode + 0xff;
      return (art_node_t *)node;
    }
    uVar6 = (ulong)(uVar5 & 0xff) ^ 1;
    node_00 = *(art_node48_t **)((long)node + uVar6 * 8 + 0x10);
    if (((ulong)node_00 & 1) == 0) {
      uVar1 = node[1].prefix[uVar6 - 1];
      __src = (node_00->base).prefix;
      memmove((node_00->base).prefix + (ulong)node->prefix_size + 1,__src,
              (ulong)(node_00->base).prefix_size);
      memcpy(__src,node->prefix,(ulong)node->prefix_size);
      (node_00->base).prefix[node->prefix_size] = uVar1;
      (node_00->base).prefix_size = node->prefix_size + (node_00->base).prefix_size + '\x01';
    }
    break;
  case '\x01':
    uVar6 = (ulong)node[1].typecode;
    if (uVar6 != 0) {
      sVar8 = uVar6 * 8;
      lVar9 = 1 - uVar6;
      lVar10 = 4;
      do {
        sVar8 = sVar8 - 8;
        if (node->prefix[lVar10 + 2] == key_chunk) {
          memmove(node->prefix + lVar10 + 2,node->prefix + lVar10 + 3,-lVar9);
          memmove((void *)((long)node + lVar10 * 8 + -8),(void *)((long)node + lVar10 * 8),sVar8);
          node[1].typecode = node[1].typecode + 0xff;
          break;
        }
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 1);
    }
    if (4 < node[1].typecode) {
      return (art_node_t *)node;
    }
    bVar3 = node->prefix_size;
    node_00 = (art_node48_t *)roaring_malloc(0x30);
    (node_00->base).typecode = '\0';
    (node_00->base).prefix_size = bVar3;
    memcpy((node_00->base).prefix,node->prefix,(ulong)bVar3);
    node_00->count = '\0';
    lVar9 = 3;
    do {
      art_node4_insert((art_node4_t *)node_00,*(art_node_t **)((long)node + lVar9 * 8),
                       node->prefix[lVar9 + 3]);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 7);
    break;
  case '\x02':
    bVar3 = node[2].prefix[key_chunk];
    if (bVar3 == 0x30) {
      return (art_node_t *)node;
    }
    node[2].prefix[key_chunk] = '0';
    *(ulong *)&node[1].prefix_size = *(ulong *)&node[1].prefix_size | 1L << (bVar3 & 0x3f);
    bVar3 = node[1].typecode - 1;
    node[1].typecode = bVar3;
    if (0x10 < bVar3) {
      return (art_node_t *)node;
    }
    bVar3 = node->prefix_size;
    node_00 = (art_node48_t *)roaring_malloc(0x98);
    (node_00->base).typecode = '\x01';
    (node_00->base).prefix_size = bVar3;
    memcpy((node_00->base).prefix,node->prefix,(ulong)bVar3);
    node_00->count = '\0';
    lVar9 = 0;
    do {
      if ((ulong)node[2].prefix[lVar9] != 0x30) {
        art_node16_insert((art_node16_t *)node_00,
                          *(art_node_t **)((long)node + (ulong)node[2].prefix[lVar9] * 8 + 0x110),
                          (uint8_t)lVar9);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x100);
    break;
  case '\x03':
    *(undefined8 *)((long)node + (ulong)key_chunk * 8 + 0x10) = 0;
    uVar2._0_1_ = node[1].prefix_size;
    uVar2._1_1_ = node[1].prefix[0];
    uVar2._2_1_ = node[1].prefix[1];
    uVar2._3_1_ = node[1].prefix[2];
    uVar4 = (short)uVar2 - 1;
    *(ushort *)&node[1].prefix_size = uVar4;
    if (0x30 < uVar4) {
      return (art_node_t *)node;
    }
    bVar3 = node->prefix_size;
    node_00 = (art_node48_t *)roaring_malloc(0x290);
    (node_00->base).typecode = '\x02';
    (node_00->base).prefix_size = bVar3;
    memcpy((node_00->base).prefix,node->prefix,(ulong)bVar3);
    node_00->count = '\0';
    node_00->available_children = 0xffffffffffff;
    memset(node_00->keys,0x30,0x100);
    lVar9 = 0;
    do {
      child = *(art_node_t **)((long)node + lVar9 * 8 + 0x10);
      if (child != (art_node_t *)0x0) {
        art_node48_insert(node_00,child,(uint8_t)lVar9);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x100);
    break;
  default:
    return (art_node_t *)0x0;
  }
  roaring_free(node);
  return (art_node_t *)node_00;
}

Assistant:

static art_node_t *art_node_erase(art_inner_node_t *node,
                                  art_key_chunk_t key_chunk) {
    switch (art_get_type(node)) {
        case ART_NODE4_TYPE:
            return art_node4_erase((art_node4_t *)node, key_chunk);
        case ART_NODE16_TYPE:
            return art_node16_erase((art_node16_t *)node, key_chunk);
        case ART_NODE48_TYPE:
            return art_node48_erase((art_node48_t *)node, key_chunk);
        case ART_NODE256_TYPE:
            return art_node256_erase((art_node256_t *)node, key_chunk);
        default:
            assert(false);
            return NULL;
    }
}